

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

JSON_Value * jag_FindFirstNonNull(JSON_Array *pArr,initializer_list<unsigned_long> aIdx)

{
  JSON_Value_Type JVar1;
  JSON_Array *array;
  JSON_Value *value;
  JSON_Value *pVal;
  size_t i;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<unsigned_long> *__range1;
  initializer_list<unsigned_long> *in_stack_ffffffffffffffc0;
  JSON_Array *local_30;
  initializer_list<unsigned_long> local_18;
  
  local_30 = (JSON_Array *)std::initializer_list<unsigned_long>::begin(&local_18);
  array = (JSON_Array *)std::initializer_list<unsigned_long>::end(in_stack_ffffffffffffffc0);
  while( true ) {
    if (local_30 == array) {
      return (JSON_Value *)0x0;
    }
    value = json_array_get_value(array,(size_t)local_30->wrapping_value);
    if ((value != (JSON_Value *)0x0) && (JVar1 = json_value_get_type(value), JVar1 != 1)) break;
    local_30 = (JSON_Array *)&local_30->items;
  }
  return value;
}

Assistant:

JSON_Value* jag_FindFirstNonNull(const JSON_Array* pArr, std::initializer_list<size_t> aIdx)
{
    for (size_t i: aIdx) {
        JSON_Value* pVal = json_array_get_value(pArr, i);
        if (pVal && json_value_get_type(pVal) != JSONNull)
            return pVal;
    }
    return nullptr;
}